

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

QByteArray * generateQualifiedClassNameIdentifier(QByteArray *identifier)

{
  QByteArrayView a;
  bool bVar1;
  QLatin1StringView *pQVar2;
  iterator *in_RDI;
  long in_FS_OFFSET;
  TokenizerResult<QLatin1StringView,_QLatin1Char> *__range1;
  QByteArray *qualifiedClassNameIdentifier;
  QLatin1StringView scope;
  sentinel __end1;
  iterator __begin1;
  undefined7 in_stack_ffffffffffffff08;
  char in_stack_ffffffffffffff0f;
  iterator *c;
  QLatin1StringView *in_stack_ffffffffffffff20;
  QStringTokenizerBase<QLatin1StringView,_QChar> *this;
  QLatin1StringView local_90;
  undefined1 local_79;
  undefined1 local_78 [63];
  QLatin1Char local_39 [17];
  QStringTokenizerBase<QLatin1StringView,_QChar> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&in_RDI->tokenizer = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->current).value.m_data = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->current).value.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  c = in_RDI;
  QByteArray::QByteArray((QByteArray *)in_stack_ffffffffffffff20,(char *)in_RDI,(qsizetype)in_RDI);
  QLatin1StringView::QLatin1StringView(in_stack_ffffffffffffff20,(QByteArray *)c);
  QLatin1Char::QLatin1Char(local_39,':');
  qTokenize<QLatin1StringView,QLatin1Char,Qt::SplitBehaviorFlags>
            (in_stack_ffffffffffffff20,(QLatin1Char *)c,(SplitBehaviorFlags)((ulong)in_RDI >> 0x20))
  ;
  this = &local_28;
  memset(local_78,0xaa,0x38);
  QStringTokenizerBase<QLatin1StringView,_QChar>::begin
            ((QStringTokenizerBase<QLatin1StringView,_QChar> *)in_RDI);
  local_79 = 0xaa;
  QStringTokenizerBase<QLatin1StringView,_QChar>::end(this);
  while (bVar1 = operator!=(local_78), bVar1) {
    local_90.m_data = &DAT_aaaaaaaaaaaaaaaa;
    local_90.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = QStringTokenizerBase<QLatin1StringView,_QChar>::iterator::operator*
                       ((iterator *)0x10bca1);
    local_90.m_data = pQVar2->m_data;
    local_90.m_size = pQVar2->m_size;
    QLatin1StringView::size(&local_90);
    QByteArray::number((qlonglong)c,(int)((ulong)in_RDI >> 0x20));
    QByteArray::operator+=
              ((QByteArray *)in_RDI,
               (QByteArray *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    QByteArray::~QByteArray((QByteArray *)0x10bce7);
    QByteArrayView::QByteArrayView<QLatin1StringView,_true>
              ((QByteArrayView *)in_stack_ffffffffffffff20,(QLatin1StringView *)c);
    a.m_data = (storage_type *)this;
    a.m_size = (qsizetype)in_stack_ffffffffffffff20;
    QByteArray::operator+=
              ((QByteArray *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),a);
    QStringTokenizerBase<QLatin1StringView,_QChar>::iterator::operator++(in_RDI);
  }
  QByteArray::operator+=((QByteArray *)in_RDI,in_stack_ffffffffffffff0f);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QByteArray *)c;
}

Assistant:

static QByteArray generateQualifiedClassNameIdentifier(const QByteArray &identifier)
{
    // This is similar to the IA-64 C++ ABI mangling scheme.
    QByteArray qualifiedClassNameIdentifier = "ZN";
    for (const auto scope : qTokenize(QLatin1StringView(identifier), QLatin1Char(':'),
                                      Qt::SkipEmptyParts)) {
        qualifiedClassNameIdentifier += QByteArray::number(scope.size());
        qualifiedClassNameIdentifier += scope;
    }
    qualifiedClassNameIdentifier += 'E';
    return qualifiedClassNameIdentifier;
}